

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O2

DdNode * Cudd_ShortestPath(DdManager *manager,DdNode *f,int *weight,int *support,int *length)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  st__table *visited;
  DdNode *pDVar4;
  long lVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  int local_a4;
  DdNode *local_98;
  int local_8c;
  cuddPathPair *rootPair;
  int *local_40;
  cuddPathPair *T_pair;
  
  local_98 = manager->one;
  pDVar4 = manager->zero;
  one = local_98;
  zero = pDVar4;
  if (support != (int *)0x0) {
    for (lVar5 = 0; lVar5 < manager->size; lVar5 = lVar5 + 1) {
      support[lVar5] = 0;
    }
  }
  local_98 = (DdNode *)((ulong)local_98 ^ 1);
  local_8c = 1000000;
  if (pDVar4 != f && local_98 != f) {
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getShortest(f,weight,support,visited);
      iVar3 = st__lookup(visited,(char *)((ulong)f & 0xfffffffffffffffe),(char **)&rootPair);
      if (iVar3 == 0) {
        return (DdNode *)0x0;
      }
      local_8c = *(int *)((long)&rootPair->pos + (ulong)((uint)f * 4 & 4));
      local_98 = one;
      piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
      uVar8 = (uint)f & 1;
      local_a4 = local_8c;
      while ((ulong)*puVar7 != 0x7fffffff) {
        iVar3 = 1;
        if (weight != (int *)0x0) {
          iVar3 = weight[*puVar7];
        }
        iVar3 = local_a4 - iVar3;
        uVar6 = *(ulong *)(puVar7 + 6) ^ 1;
        uVar2 = *(ulong *)(puVar7 + 4) ^ 1;
        if (uVar8 == 0) {
          uVar6 = *(ulong *)(puVar7 + 6);
          uVar2 = *(ulong *)(puVar7 + 4);
        }
        st__lookup(visited,(char *)(uVar2 & 0xfffffffffffffffe),(char **)&T_pair);
        if ((uVar2 & 1) == 0) {
          if (T_pair->pos == iVar3) {
            uVar8 = 0;
            goto LAB_0066b578;
          }
LAB_0066b4db:
          st__lookup(visited,(char *)(uVar6 & 0xfffffffffffffffe),(char **)&local_40);
          if ((uVar6 & 1) == 0) {
            iVar3 = *local_40;
          }
          else {
            iVar3 = local_40[1];
          }
          if (iVar3 != local_a4) {
            fwrite("We shouldn\'t be here!!\n",0x17,1,(FILE *)manager->err);
            manager->errorCode = CUDD_INTERNAL_ERROR;
LAB_0066b612:
            local_98 = (DdNode *)0x0;
            goto LAB_0066b615;
          }
          pDVar4 = cuddBddAndRecur(manager,(DdNode *)((ulong)manager->vars[*puVar7] ^ 1),local_98);
          if (pDVar4 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,local_98);
            goto LAB_0066b612;
          }
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,local_98);
          puVar7 = (uint *)(uVar6 & 0xfffffffffffffffe);
          local_98 = pDVar4;
          uVar8 = (uint)uVar6 & 1;
        }
        else {
          if (T_pair->neg != iVar3) goto LAB_0066b4db;
          uVar8 = 1;
LAB_0066b578:
          pDVar4 = cuddBddAndRecur(manager,manager->vars[*puVar7],local_98);
          if (pDVar4 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,local_98);
            local_98 = (DdNode *)0x0;
            goto LAB_0066b615;
          }
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,local_98);
          puVar7 = (uint *)(uVar2 & 0xfffffffffffffffe);
          local_98 = pDVar4;
          local_a4 = iVar3;
        }
      }
      piVar1 = (int *)(((ulong)local_98 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
LAB_0066b615:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = local_8c;
  return local_98;
}

Assistant:

DdNode *
Cudd_ShortestPath(
  DdManager * manager,
  DdNode * f,
  int * weight,
  int * support,
  int * length)
{
    DdNode      *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;
    int         i;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    /* Initialize support. Support does not depend on variable order.
    ** Hence, it does not need to be reinitialized if reordering occurs.
    */
    if (support) {
      for (i = 0; i < manager->size; i++) {
        support[i] = 0;
      }
    }

    if (f == Cudd_Not(one) || f == zero) {
      *length = DD_BIGGY;
      return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getShortest(f, weight, support, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getPath(manager,visited,f,weight,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}